

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderNinjaBar(CHud *this,float x,float y,float Progress)

{
  int iVar1;
  CDataSprite *pCVar2;
  int iVar3;
  IGraphics *pIVar4;
  CDataSprite *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar5;
  float x_00;
  float w_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float y2_1;
  float y1_1;
  float x2_1;
  float x1_1;
  int cy_1;
  int cx_1;
  int h_1;
  float w_1;
  float spy_1;
  float spx_1;
  float y2;
  float y1;
  float x2;
  float x1;
  int cy;
  int cx;
  int h;
  float w;
  int spy;
  int spx;
  float EmptyBarWidth;
  float FullBarWidth;
  float MiddleBarWidth;
  float WholeBarWidth;
  float BarHeight;
  float EndWidth;
  CQuadItem QuadEndEmpty;
  CQuadItem QuadEmpty;
  CDataSprite SpriteBarEmpty;
  CDataSprite SpriteBarFull;
  CQuadItem QuadFull;
  CQuadItem QuadStartFull;
  undefined8 in_stack_fffffffffffffee0;
  int iVar9;
  CQuadItem *this_00;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  uint Flags;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  CQuadItem local_88;
  CQuadItem local_78;
  char *local_68;
  CDataSpriteset *pCStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_48;
  CDataSpriteset *local_40;
  undefined8 local_38;
  undefined8 local_30;
  CQuadItem local_28;
  CQuadItem local_18;
  long local_8;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar5 = clamp<float>(in_XMM2_Da,0.0,1.0);
  IGraphics::CQuadItem::CQuadItem(&local_18,in_XMM0_Da,in_XMM1_Da,6.0,12.0);
  CComponent::RenderTools((CComponent *)0x167e2b);
  CRenderTools::SelectSprite
            ((CRenderTools *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),in_RDI,
             in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,iVar9);
  pIVar4 = CComponent::Graphics((CComponent *)0x167e5b);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,&local_18,1);
  x_00 = in_XMM0_Da + 6.0;
  w_00 = fVar5 * 108.0;
  IGraphics::CQuadItem::CQuadItem(&local_28,x_00,in_XMM1_Da,w_00,12.0);
  pCVar2 = g_pData->m_aSprites;
  local_48 = pCVar2[0x42].m_pName;
  local_40 = pCVar2[0x42].m_pSet;
  local_38._0_4_ = pCVar2[0x42].m_X;
  local_38._4_4_ = pCVar2[0x42].m_Y;
  local_30._0_4_ = pCVar2[0x42].m_W;
  local_30._4_4_ = pCVar2[0x42].m_H;
  if (0.1 <= fVar5) {
    CComponent::RenderTools((CComponent *)0x168070);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),in_RDI,
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,iVar9);
  }
  else {
    fVar5 = (float)(int)(undefined4)local_30;
    iVar9 = local_40->m_Gridx;
    iVar1 = local_40->m_Gridy;
    fVar6 = (float)(int)(undefined4)local_38;
    fVar7 = (float)(int)(undefined4)local_38;
    fVar8 = (float)(int)local_38._4_4_;
    iVar3 = local_38._4_4_ + local_30._4_4_;
    pIVar4 = CComponent::Graphics((CComponent *)0x16803b);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])
              (fVar6 / (float)iVar9,fVar8 / (float)iVar1,
               ((fVar7 + fVar5 * 0.1) - 0.03125) / (float)iVar9,
               ((float)iVar3 - 0.03125) / (float)iVar1,pIVar4,0xffffffff);
  }
  pIVar4 = CComponent::Graphics((CComponent *)0x168093);
  Flags = 1;
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,&local_28);
  pCVar2 = g_pData->m_aSprites;
  local_68 = pCVar2[0x43].m_pName;
  pCStack_60 = pCVar2[0x43].m_pSet;
  local_58._0_4_ = pCVar2[0x43].m_X;
  local_58._4_4_ = pCVar2[0x43].m_Y;
  uStack_50._0_4_ = pCVar2[0x43].m_W;
  uStack_50._4_4_ = pCVar2[0x43].m_H;
  fVar5 = (float)(int)(undefined4)local_58;
  fVar6 = (float)(int)local_58._4_4_;
  fVar7 = (float)(int)(undefined4)uStack_50;
  iVar9 = pCStack_60->m_Gridx;
  iVar1 = pCStack_60->m_Gridy;
  fVar8 = ((fVar6 + (float)(int)uStack_50._4_4_) - 0.03125) / (float)iVar1;
  pIVar4 = CComponent::Graphics((CComponent *)0x1681d8);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])
            ((fVar5 + 0.1) / (float)iVar9,fVar6 / (float)iVar1,
             ((fVar5 + 0.1 + fVar7 * 0.5) - 0.03125) / (float)iVar9,fVar8,pIVar4,0xffffffff);
  IGraphics::CQuadItem::CQuadItem(&local_78,x_00 + w_00,in_XMM1_Da,108.0 - w_00,12.0);
  pIVar4 = CComponent::Graphics((CComponent *)0x168255);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,&local_78,(ulong)Flags);
  this_00 = &local_88;
  IGraphics::CQuadItem::CQuadItem(this_00,x_00 + 108.0,in_XMM1_Da,6.0,12.0);
  CComponent::RenderTools((CComponent *)0x1682c6);
  CRenderTools::SelectSprite
            ((CRenderTools *)CONCAT44(fVar8,in_stack_fffffffffffffef8),in_RDI,Flags,
             in_stack_fffffffffffffee8,(int)((ulong)this_00 >> 0x20));
  pIVar4 = CComponent::Graphics((CComponent *)0x1682f4);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,this_00,(ulong)Flags);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderNinjaBar(float x, float y, float Progress)
{
	Progress = clamp(Progress, 0.0f, 1.0f);
	const float EndWidth = 6.0f;
	const float BarHeight = 12.0f;
	const float WholeBarWidth = 120.f;
	const float MiddleBarWidth = WholeBarWidth - (EndWidth * 2.0f);

	IGraphics::CQuadItem QuadStartFull(x, y, EndWidth, BarHeight);
	RenderTools()->SelectSprite(&g_pData->m_aSprites[SPRITE_NINJA_BAR_FULL_LEFT]);
	Graphics()->QuadsDrawTL(&QuadStartFull, 1);
	x += EndWidth;

	const float FullBarWidth = MiddleBarWidth * Progress;
	const float EmptyBarWidth = MiddleBarWidth - FullBarWidth;

	// full bar
	IGraphics::CQuadItem QuadFull(x, y, FullBarWidth, BarHeight);

	CDataSprite SpriteBarFull = g_pData->m_aSprites[SPRITE_NINJA_BAR_FULL];
	// prevent pixel puree, select only a small slice
	if(Progress < 0.1f)
	{
		int spx = SpriteBarFull.m_X;
		int spy = SpriteBarFull.m_Y;
		float w = SpriteBarFull.m_W * 0.1f; // magic here
		int h = SpriteBarFull.m_H;
		int cx = SpriteBarFull.m_pSet->m_Gridx;
		int cy = SpriteBarFull.m_pSet->m_Gridy;
		float x1 = spx/(float)cx;
		float x2 = (spx+w-1/32.0f)/(float)cx;
		float y1 = spy/(float)cy;
		float y2 = (spy+h-1/32.0f)/(float)cy;

		Graphics()->QuadsSetSubset(x1, y1, x2, y2);
	}
	else
		RenderTools()->SelectSprite(&SpriteBarFull);

	Graphics()->QuadsDrawTL(&QuadFull, 1);

	// empty bar
	// select the middle portion of the sprite so we don't get edge bleeding
	const CDataSprite SpriteBarEmpty = g_pData->m_aSprites[SPRITE_NINJA_BAR_EMPTY];
	{
		float spx = SpriteBarEmpty.m_X + 0.1f;
		float spy = SpriteBarEmpty.m_Y;
		float w = SpriteBarEmpty.m_W * 0.5f;
		int h = SpriteBarEmpty.m_H;
		int cx = SpriteBarEmpty.m_pSet->m_Gridx;
		int cy = SpriteBarEmpty.m_pSet->m_Gridy;
		float x1 = spx/(float)cx;
		float x2 = (spx+w-1/32.0f)/(float)cx;
		float y1 = spy/(float)cy;
		float y2 = (spy+h-1/32.0f)/(float)cy;

		Graphics()->QuadsSetSubset(x1, y1, x2, y2);
	}

	IGraphics::CQuadItem QuadEmpty(x + FullBarWidth, y, EmptyBarWidth, BarHeight);
	Graphics()->QuadsDrawTL(&QuadEmpty, 1);

	x += MiddleBarWidth;

	IGraphics::CQuadItem QuadEndEmpty(x, y, EndWidth, BarHeight);
	RenderTools()->SelectSprite(&g_pData->m_aSprites[SPRITE_NINJA_BAR_EMPTY_RIGHT]);
	Graphics()->QuadsDrawTL(&QuadEndEmpty, 1);
}